

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O1

size_t __thiscall CoreML::Specification::Int64ToStringMap::ByteSizeLong(Int64ToStringMap *this)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  const_iterator it;
  iterator_base<const_google::protobuf::MapPair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  iterator_base<const_google::protobuf::MapPair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  
  local_30.m_ = (InnerMap *)&this->map_;
  sVar3 = (size_t)(uint)(this->map_).map_.elements_.num_elements_;
  google::protobuf::
  Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  InnerMap::
  iterator_base<const_google::protobuf::MapPair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::SearchFrom(&local_30,(this->map_).map_.elements_.index_of_first_non_null_);
  local_48.m_ = local_30.m_;
  local_48.node_ = local_30.node_;
  while (local_48.node_ != (Node *)0x0) {
    sVar2 = google::protobuf::internal::
            MapEntryFuncs<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)9>
            ::ByteSizeLong((long *)local_48.node_,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &(local_48.node_)->field_0x8);
    sVar3 = sVar3 + sVar2;
    google::protobuf::
    Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    InnerMap::
    iterator_base<const_google::protobuf::MapPair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&local_48);
  }
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    sVar3 = sVar3 + *(long *)((uVar1 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar3;
  return sVar3;
}

Assistant:

size_t Int64ToStringMap::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.Int64ToStringMap)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // map<int64, string> map = 1;
  total_size += 1 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(this->_internal_map_size());
  for (::PROTOBUF_NAMESPACE_ID::Map< int64_t, std::string >::const_iterator
      it = this->_internal_map().begin();
      it != this->_internal_map().end(); ++it) {
    total_size += Int64ToStringMap_MapEntry_DoNotUse::Funcs::ByteSizeLong(it->first, it->second);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}